

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingDuration.cpp
# Opt level: O0

int main(void)

{
  Severity SVar1;
  SessionWriter *pSVar2;
  data_ref pacVar3;
  data_ref pacVar4;
  uint64_t clock;
  uint64_t _binlog_sid_v_1;
  uint64_t _binlog_sid_v;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_3;
  memory_order __b_1;
  EventSource *in_stack_fffffffffffffa80;
  char (*in_stack_fffffffffffffa88) [9];
  char (*pacVar5) [9];
  uint64_t in_stack_fffffffffffffa90;
  atomic<unsigned_long> *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffaa4;
  EventSource *in_stack_fffffffffffffaa8;
  Session *in_stack_fffffffffffffab0;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffb18;
  atomic<unsigned_long> *paVar6;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  SessionWriter *in_stack_fffffffffffffb28;
  __atomic_base<unsigned_long> in_stack_fffffffffffffb30;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffb38;
  atomic<unsigned_long> *in_stack_fffffffffffffb40;
  int local_40c;
  duration<long,_std::ratio<60L,_1L>_> local_408;
  int local_3fc;
  duration<long,std::ratio<60l,1l>> local_3f8 [12];
  int local_3ec;
  duration<long,std::ratio<1l,1l>> local_3e8 [15];
  undefined1 local_3d9;
  undefined1 local_3d8;
  undefined1 local_3d7;
  undefined1 local_3d6;
  undefined1 local_3d5 [17];
  int local_3c4;
  duration<long,std::ratio<60l,1l>> local_3c0 [12];
  int local_3b4;
  duration<long,std::ratio<1l,1l>> local_3b0 [9];
  cx_string<154UL> local_3a7;
  allocator local_30c;
  allocator local_30b;
  allocator local_30a;
  allocator local_309;
  undefined8 local_308;
  undefined2 local_300;
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  undefined8 local_298;
  string local_290 [32];
  string local_270 [32];
  char (*local_250) [9];
  int local_244;
  duration<long,_std::ratio<1L,_1000000L>_> local_240;
  int local_234;
  duration<long,std::ratio<1l,1000000l>> local_230 [12];
  int local_224;
  duration<long,std::ratio<1l,1000000000l>> local_220 [15];
  undefined1 local_211;
  undefined1 local_210;
  undefined1 local_20f;
  undefined1 local_20e;
  allocator local_20d;
  int local_20c;
  duration<long,std::ratio<1l,1000l>> local_208 [12];
  int local_1fc;
  duration<long,std::ratio<1l,1000000l>> local_1f8 [12];
  int local_1ec;
  duration<long,std::ratio<1l,1000000000l>> local_1e8 [12];
  cx_string<140UL> local_1dc;
  allocator local_14f;
  allocator local_14e;
  allocator local_14d [20];
  allocator local_139;
  undefined8 local_138;
  undefined2 local_130;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  undefined8 local_c8;
  string local_c0 [32];
  string local_a0 [32];
  __atomic_base<unsigned_long> local_80;
  undefined4 local_74;
  char (*local_70) [9];
  memory_order local_68;
  int local_64;
  atomic<unsigned_long> *local_60;
  __atomic_base<unsigned_long> local_58;
  memory_order local_50;
  undefined4 local_4c;
  atomic<unsigned_long> *local_48;
  char (*local_40) [9];
  memory_order local_38;
  int local_34;
  char (*local_30) [9];
  atomic<unsigned_long> *local_28;
  duration<long,_std::ratio<60L,_1L>_> *local_20;
  memory_order local_18;
  int local_14;
  duration<long,_std::ratio<60L,_1L>_> *local_10;
  atomic<unsigned_long> *local_8;
  
  local_74 = 0;
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x1024b7);
  if (SVar1 < 0x81) {
    local_48 = &main::_binlog_sid;
    local_4c = 0;
    local_50 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_58 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_80 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_138 = 0;
      local_130 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"main",&local_139);
      local_211 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"main",local_14d);
      local_210 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingDuration.cpp"
                 ,&local_14e);
      local_20f = 1;
      local_c8 = 0xf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"{} {} {}",&local_14f);
      local_20e = 1;
      local_1ec = 1;
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
                (local_1e8,&local_1ec);
      local_1fc = 2;
      std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_1f8,&local_1fc);
      local_20c = 3;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_208,&local_20c);
      binlog::detail::
      concatenated_tags<char_const(&)[9],std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
                ((char (*) [9])in_stack_fffffffffffffb30._M_i,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffb28,
                 (duration<long,_std::ratio<1L,_1000000L>_> *)
                 CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 in_stack_fffffffffffffb18);
      pacVar3 = mserialize::cx_string<140UL>::data(&local_1dc);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,*pacVar3,&local_20d);
      local_20e = 0;
      local_20f = 0;
      local_210 = 0;
      local_211 = 0;
      local_80._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      binlog::EventSource::~EventSource(in_stack_fffffffffffffa80);
      std::allocator<char>::~allocator((allocator<char> *)&local_20d);
      std::allocator<char>::~allocator((allocator<char> *)&local_14f);
      std::allocator<char>::~allocator((allocator<char> *)&local_14e);
      std::allocator<char>::~allocator((allocator<char> *)local_14d);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      local_8 = &main::_binlog_sid;
      local_10 = (duration<long,_std::ratio<60L,_1L>_> *)local_80._M_i;
      local_14 = 5;
      in_stack_fffffffffffffb40 = &main::_binlog_sid;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10;
      if (local_14 == 3) {
        (in_stack_fffffffffffffb40->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_10;
      }
      else if (local_14 == 5) {
        LOCK();
        (in_stack_fffffffffffffb40->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_10;
        UNLOCK();
      }
      else {
        (in_stack_fffffffffffffb40->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_10;
      }
    }
    in_stack_fffffffffffffb28 = binlog::default_thread_local_writer();
    in_stack_fffffffffffffb30._M_i = local_80._M_i;
    in_stack_fffffffffffffb38 = (duration<long,_std::ratio<1L,_1L>_> *)binlog::clockNow();
    local_224 = 1;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>(local_220,&local_224)
    ;
    local_234 = 2;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_230,&local_234);
    local_244 = 3;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_240,&local_244);
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[9],std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
              ((SessionWriter *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (uint64_t)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               in_stack_fffffffffffffa88,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffa80,&local_240,
               (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffab0);
  }
  pSVar2 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar2);
  SVar1 = binlog::Session::minSeverity((Session *)0x102ba1);
  if (SVar1 < 0x81) {
    local_60 = &main::_binlog_sid;
    local_64 = 0;
    paVar6 = &main::_binlog_sid;
    local_68 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_64 - 1U < 2) {
      local_70 = (char (*) [9])(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_64 == 5) {
      local_70 = (char (*) [9])(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_70 = (char (*) [9])(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    local_250 = local_70;
    if (local_70 == (char (*) [9])0x0) {
      pSVar2 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar2);
      local_308 = 0;
      local_300 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"main",&local_309);
      local_3d9 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,"main",&local_30a);
      local_3d8 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingDuration.cpp"
                 ,&local_30b);
      local_3d7 = 1;
      local_298 = 0x11;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_290,"{} {} {}",&local_30c);
      local_3d6 = 1;
      local_3b4 = 4;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_3b0,&local_3b4);
      local_3c4 = 5;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>(local_3c0,&local_3c4);
      local_3d5._1_4_ = 6;
      std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                ((duration<long,std::ratio<3600l,1l>> *)(local_3d5 + 5),(int *)(local_3d5 + 1));
      binlog::detail::
      concatenated_tags<char_const(&)[9],std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<60l,1l>>,std::chrono::duration<long,std::ratio<3600l,1l>>>
                ((char (*) [9])in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                 (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffb30._M_i,
                 (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffffb28);
      pacVar4 = mserialize::cx_string<154UL>::data(&local_3a7);
      in_stack_fffffffffffffab0 = (Session *)local_3d5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,*pacVar4,(allocator *)in_stack_fffffffffffffab0);
      local_3d6 = 0;
      local_3d7 = 0;
      local_3d8 = 0;
      local_3d9 = 0;
      local_250 = (char (*) [9])
                  binlog::Session::addEventSource
                            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      binlog::EventSource::~EventSource(in_stack_fffffffffffffa80);
      std::allocator<char>::~allocator((allocator<char> *)local_3d5);
      std::allocator<char>::~allocator((allocator<char> *)&local_30c);
      std::allocator<char>::~allocator((allocator<char> *)&local_30b);
      std::allocator<char>::~allocator((allocator<char> *)&local_30a);
      std::allocator<char>::~allocator((allocator<char> *)&local_309);
      local_28 = &main::_binlog_sid;
      local_30 = local_250;
      local_34 = 5;
      in_stack_fffffffffffffa98 = &main::_binlog_sid;
      local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_40 = local_30;
      in_stack_fffffffffffffaa4 = local_34;
      if (local_34 == 3) {
        (in_stack_fffffffffffffa98->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_30;
      }
      else if (local_34 == 5) {
        LOCK();
        (in_stack_fffffffffffffa98->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_30;
        UNLOCK();
      }
      else {
        (in_stack_fffffffffffffa98->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_30;
      }
    }
    in_stack_fffffffffffffa80 = (EventSource *)binlog::default_thread_local_writer();
    pacVar5 = local_250;
    clock = binlog::clockNow();
    local_3ec = 4;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_3e8,&local_3ec);
    local_3fc = 5;
    std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>(local_3f8,&local_3fc);
    local_40c = 6;
    std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
              ((duration<long,std::ratio<3600l,1l>> *)&local_408,&local_40c);
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[9],std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<60l,1l>>,std::chrono::duration<long,std::ratio<3600l,1l>>>
              ((SessionWriter *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (uint64_t)in_stack_fffffffffffffa98,clock,pacVar5,
               (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffa80,&local_408,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffffab0);
  }
  binlog::consume<std::ostream>
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa80);
  return 0;
}

Assistant:

int main()
{

  //[duration

  BINLOG_INFO("{} {} {}", std::chrono::nanoseconds{1}, std::chrono::microseconds{2}, std::chrono::milliseconds{3});
  // Outputs: 1ns 2us 3ms
  BINLOG_INFO("{} {} {}", std::chrono::seconds{4}, std::chrono::minutes{5}, std::chrono::hours{6});
  // Outputs: 4s 5m 6h
  //]


  binlog::consume(std::cout);
  return 0;
}